

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

UV_PREDICTION_MODE
read_intra_mode_uv(FRAME_CONTEXT *ec_ctx,aom_reader *r,CFL_ALLOWED_TYPE cfl_allowed,
                  PREDICTION_MODE y_mode)

{
  int iVar1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  
  iVar1 = aom_read_symbol_(r,ec_ctx->uv_mode_cdf
                             [CONCAT71(in_register_00000011,cfl_allowed) & 0xffffffff]
                             [CONCAT71(in_register_00000009,y_mode) & 0xffffffff],
                           0xe - (uint)((int)CONCAT71(in_register_00000011,cfl_allowed) == 0));
  return (UV_PREDICTION_MODE)iVar1;
}

Assistant:

static UV_PREDICTION_MODE read_intra_mode_uv(FRAME_CONTEXT *ec_ctx,
                                             aom_reader *r,
                                             CFL_ALLOWED_TYPE cfl_allowed,
                                             PREDICTION_MODE y_mode) {
  const UV_PREDICTION_MODE uv_mode =
      aom_read_symbol(r, ec_ctx->uv_mode_cdf[cfl_allowed][y_mode],
                      UV_INTRA_MODES - !cfl_allowed, ACCT_STR);
  return uv_mode;
}